

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_sei.c
# Opt level: O0

MPP_RET process_sei(H264_SLICE_t *currSlice)

{
  H264_SEI_t *sei_msg_00;
  MPP_RET MVar1;
  RK_U32 RVar2;
  h264_sei_t *phVar3;
  int local_94;
  int local_90;
  RK_S32 _out_1;
  RK_S32 _out;
  RK_S32 i;
  BitReadCtx_t payload_bitctx;
  BitReadCtx_t *p_bitctx;
  H264_SEI_t *sei_msg;
  MPP_RET ret;
  RK_S32 tmp_byte;
  H264_SLICE_t *currSlice_local;
  
  sei_msg._0_4_ = MPP_ERR_UNKNOW;
  payload_bitctx.update_curbyte = (_func_MPP_RET_bitread_ctx_t_ptr *)&currSlice->p_Cur->bitctx;
  _out_1 = 0;
  if (currSlice->p_Cur->sei == (h264_sei_t *)0x0) {
    phVar3 = (h264_sei_t *)mpp_osal_calloc("process_sei",0xf8);
    currSlice->p_Cur->sei = phVar3;
  }
  sei_msg_00 = currSlice->p_Cur->sei;
  sei_msg_00->mvc_scalable_nesting_flag = 0;
  sei_msg_00->p_Dec = currSlice->p_Dec;
  do {
    sei_msg._4_4_ = 0xff;
    sei_msg_00->type = 0;
    while (sei_msg._4_4_ == 0xff) {
      if ((*(uint *)(payload_bitctx.update_curbyte + 8) < 2) || (0x7fffff00 < sei_msg_00->type)) {
        _mpp_log_l(2,"h264d_sei","parse payload_type error: byte_left %d payload_type %d\n",
                   (char *)0x0,(ulong)*(uint *)(payload_bitctx.update_curbyte + 8),
                   (ulong)(uint)sei_msg_00->type);
        return MPP_ERR_STREAM;
      }
      MVar1 = mpp_read_bits((BitReadCtx_t *)payload_bitctx.update_curbyte,8,&local_90);
      *(MPP_RET *)(payload_bitctx.update_curbyte + 0x44) = MVar1;
      if (*(int *)(payload_bitctx.update_curbyte + 0x44) != 0) {
        return (MPP_RET)sei_msg;
      }
      sei_msg._4_4_ = local_90;
      sei_msg_00->type = local_90 + sei_msg_00->type;
    }
    sei_msg._4_4_ = 0xff;
    sei_msg_00->payload_size = 0;
    while (sei_msg._4_4_ == 0xff) {
      if (*(int *)(payload_bitctx.update_curbyte + 8) < sei_msg_00->payload_size + 1) {
        _mpp_log_l(2,"h264d_sei","parse payload_size error: byte_left %d payload_size %d\n",
                   (char *)0x0,(ulong)*(uint *)(payload_bitctx.update_curbyte + 8),
                   (ulong)(sei_msg_00->payload_size + 1));
        return MPP_ERR_STREAM;
      }
      MVar1 = mpp_read_bits((BitReadCtx_t *)payload_bitctx.update_curbyte,8,&local_94);
      *(MPP_RET *)(payload_bitctx.update_curbyte + 0x44) = MVar1;
      if (*(int *)(payload_bitctx.update_curbyte + 0x44) != 0) {
        return (MPP_RET)sei_msg;
      }
      sei_msg._4_4_ = local_94;
      sei_msg_00->payload_size = local_94 + sei_msg_00->payload_size;
    }
    if (*(int *)(payload_bitctx.update_curbyte + 8) < sei_msg_00->payload_size) {
      _mpp_log_l(2,"h264d_sei","parse payload_size error: byte_left %d payload_size %d\n",
                 (char *)0x0,(ulong)*(uint *)(payload_bitctx.update_curbyte + 8),
                 (ulong)(uint)sei_msg_00->payload_size);
      return MPP_ERR_STREAM;
    }
    if ((h264d_debug & 0x4000) != 0) {
      _mpp_log_l(4,"h264d_sei","SEI type %d, payload size: %d\n",(char *)0x0,
                 (ulong)(uint)sei_msg_00->type,(ulong)(uint)sei_msg_00->payload_size);
    }
    payload_bitctx.buf = (RK_U8 *)0x0;
    payload_bitctx.buf_len = 0;
    payload_bitctx.ret = MPP_OK;
    payload_bitctx.emulation_prevention_bytes_ = 0;
    payload_bitctx.used_bits = 0;
    payload_bitctx._52_4_ = 0;
    payload_bitctx.num_remaining_bits_in_curr_byte_ = 0;
    payload_bitctx._28_4_ = 0;
    payload_bitctx.prev_two_bytes_ = 0;
    payload_bitctx.bytes_left_ = 0;
    payload_bitctx._12_4_ = 0;
    payload_bitctx.curr_byte_ = 0;
    __out = (RK_U8 *)0x0;
    payload_bitctx.data_ = (RK_U8 *)0x0;
    payload_bitctx.prevention_type = PSEUDO_CODE_NONE;
    payload_bitctx._76_4_ = 0;
    mpp_set_bitread_ctx((BitReadCtx_t *)&_out,*(RK_U8 **)payload_bitctx.update_curbyte,
                        sei_msg_00->payload_size);
    mpp_set_bitread_pseudo_code_type((BitReadCtx_t *)&_out,PSEUDO_CODE_H264_H265_SEI);
    switch(sei_msg_00->type) {
    case 0:
      sei_msg._0_4_ =
           interpret_buffering_period_info((BitReadCtx_t *)&_out,sei_msg_00,currSlice->p_Vid);
      if ((MPP_RET)sei_msg < MPP_OK) {
        if ((h264d_debug & 4) != 0) {
          _mpp_log_l(4,"h264d_sei","Function error(%d).\n",(char *)0x0,0x122);
        }
        return (MPP_RET)sei_msg;
      }
      break;
    case 1:
      MVar1 = interpret_picture_timing_info((BitReadCtx_t *)&_out,sei_msg_00,currSlice->p_Vid);
      if (MVar1 < MPP_OK) {
        if ((h264d_debug & 4) == 0) {
          return (MPP_RET)sei_msg;
        }
        _mpp_log_l(4,"h264d_sei","Function error(%d).\n",(char *)0x0,0x125);
        return (MPP_RET)sei_msg;
      }
      break;
    default:
      if ((h264d_debug & 0x4000) != 0) {
        _mpp_log_l(4,"h264d_sei","Skip parsing SEI type %d\n",(char *)0x0,
                   (ulong)(uint)sei_msg_00->type);
      }
      break;
    case 5:
      MVar1 = check_encoder_sei_info
                        ((BitReadCtx_t *)&_out,sei_msg_00->payload_size,&currSlice->p_Vid->deny_flag
                        );
      if (MVar1 < MPP_OK) {
        if ((h264d_debug & 4) == 0) {
          return (MPP_RET)sei_msg;
        }
        _mpp_log_l(4,"h264d_sei","Function error(%d).\n",(char *)0x0,0x128);
        return (MPP_RET)sei_msg;
      }
      if ((currSlice->p_Vid->deny_flag != 0) && ((h264d_debug & 0x4000) != 0)) {
        _mpp_log_l(4,"h264d_sei","Bitstream is encoded by special encoder.",(char *)0x0);
      }
      break;
    case 6:
      MVar1 = interpret_recovery_point((BitReadCtx_t *)&_out,currSlice->p_Vid);
      if (MVar1 < MPP_OK) {
        if ((h264d_debug & 4) == 0) {
          return (MPP_RET)sei_msg;
        }
        _mpp_log_l(4,"h264d_sei","Function error(%d).\n",(char *)0x0,0x12e);
        return (MPP_RET)sei_msg;
      }
    }
    if ((h264d_debug & 0x4000) != 0) {
      _mpp_log_l(4,"h264d_sei",
                 "After parsing SEI %d, bits left int cur byte %d, bits_used %d, bytes left %d",
                 (char *)0x0,(ulong)(uint)sei_msg_00->type,payload_bitctx.curr_byte_ & 0xffffffff,
                 (undefined4)payload_bitctx.emulation_prevention_bytes_,payload_bitctx.data_._0_4_);
    }
    for (_out_1 = 0; _out_1 < sei_msg_00->payload_size; _out_1 = _out_1 + 1) {
      MVar1 = mpp_skip_longbits((BitReadCtx_t *)payload_bitctx.update_curbyte,8);
      *(MPP_RET *)(payload_bitctx.update_curbyte + 0x44) = MVar1;
      if (*(int *)(payload_bitctx.update_curbyte + 0x44) != 0) {
        return (MPP_RET)sei_msg;
      }
    }
    RVar2 = mpp_has_more_rbsp_data((BitReadCtx_t *)payload_bitctx.update_curbyte);
  } while (RVar2 != 0);
  return MPP_OK;
}

Assistant:

MPP_RET process_sei(H264_SLICE_t *currSlice)
{
    RK_S32  tmp_byte = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264_SEI_t *sei_msg  = NULL;
    BitReadCtx_t *p_bitctx = &currSlice->p_Cur->bitctx;
    BitReadCtx_t payload_bitctx;
    RK_S32 i = 0;

    if (!currSlice->p_Cur->sei)
        currSlice->p_Cur->sei = mpp_calloc(H264_SEI_t, 1);

    sei_msg = currSlice->p_Cur->sei;
    sei_msg->mvc_scalable_nesting_flag = 0;  //init to false
    sei_msg->p_Dec = currSlice->p_Dec;
    do {
        tmp_byte = 0xFF;
        sei_msg->type = 0;
        while (tmp_byte == 0xFF) {
            if (p_bitctx->bytes_left_ < 2 || sei_msg->type > INT_MAX - 255) {
                mpp_err("parse payload_type error: byte_left %d payload_type %d\n",
                        p_bitctx->bytes_left_, sei_msg->type);
                return MPP_ERR_STREAM;
            }

            READ_BITS(p_bitctx, 8, &tmp_byte);
            sei_msg->type += tmp_byte;
        }

        tmp_byte = 0xFF;
        sei_msg->payload_size = 0;
        while (tmp_byte == 0xFF) {
            if ((RK_S32)p_bitctx->bytes_left_ < sei_msg->payload_size + 1) {
                mpp_err("parse payload_size error: byte_left %d payload_size %d\n",
                        p_bitctx->bytes_left_, sei_msg->payload_size + 1);
                return MPP_ERR_STREAM;
            }

            READ_BITS(p_bitctx, 8, &tmp_byte);
            sei_msg->payload_size += tmp_byte;
        }

        if ((RK_S32)p_bitctx->bytes_left_ < sei_msg->payload_size) {
            mpp_err("parse payload_size error: byte_left %d payload_size %d\n",
                    p_bitctx->bytes_left_, sei_msg->payload_size);
            return MPP_ERR_STREAM;
        }

        H264D_DBG(H264D_DBG_SEI, "SEI type %d, payload size: %d\n", sei_msg->type, sei_msg->payload_size);

        memset(&payload_bitctx, 0, sizeof(payload_bitctx));
        mpp_set_bitread_ctx(&payload_bitctx, p_bitctx->data_, sei_msg->payload_size);
        mpp_set_bitread_pseudo_code_type(&payload_bitctx, PSEUDO_CODE_H264_H265_SEI);

        switch (sei_msg->type) {
        case H264_SEI_BUFFERING_PERIOD:
            FUN_CHECK(ret = interpret_buffering_period_info(&payload_bitctx, sei_msg, currSlice->p_Vid));
            break;
        case H264_SEI_PIC_TIMING:
            FUN_CHECK(interpret_picture_timing_info(&payload_bitctx, sei_msg, currSlice->p_Vid));
            break;
        case H264_SEI_USER_DATA_UNREGISTERED:
            FUN_CHECK(check_encoder_sei_info(&payload_bitctx, sei_msg->payload_size, &currSlice->p_Vid->deny_flag));

            if (currSlice->p_Vid->deny_flag)
                H264D_DBG(H264D_DBG_SEI, "Bitstream is encoded by special encoder.");
            break;
        case H264_SEI_RECOVERY_POINT:
            FUN_CHECK(interpret_recovery_point(&payload_bitctx, currSlice->p_Vid));
            break;
        default:
            H264D_DBG(H264D_DBG_SEI, "Skip parsing SEI type %d\n", sei_msg->type);
            break;
        }

        H264D_DBG(H264D_DBG_SEI, "After parsing SEI %d, bits left int cur byte %d, bits_used %d, bytes left %d",
                  sei_msg->type, payload_bitctx.num_remaining_bits_in_curr_byte_, payload_bitctx.used_bits,
                  payload_bitctx.bytes_left_);

        for (i = 0; i < sei_msg->payload_size; i++)
            SKIP_BITS(p_bitctx, 8);
    } while (mpp_has_more_rbsp_data(p_bitctx));    // more_rbsp_data()  msg[offset] != 0x80

    return ret = MPP_OK;
__BITREAD_ERR:
__FAILED:
    return ret;
}